

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

int hd_read_byte(hd_context *ctx,hd_stream *stm)

{
  byte *pbVar1;
  hd_error_stack_slot *phVar2;
  int iVar3;
  uint uVar4;
  
  pbVar1 = stm->rp;
  if (pbVar1 == stm->wp) {
    iVar3 = hd_push_try(ctx);
    uVar4 = 0xffffffff;
    if (iVar3 != 0) {
      iVar3 = __sigsetjmp(ctx->error->top->buffer,0);
      if (iVar3 == 0) {
        uVar4 = (*stm->next)(ctx,stm,1);
      }
    }
    phVar2 = ctx->error->top;
    ctx->error->top = phVar2 + -1;
    if (1 < phVar2->code) {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"read error; treating as end of file");
      stm->error = 1;
      uVar4 = 0xffffffff;
    }
    if (uVar4 == 0xffffffff) {
      stm->eof = 1;
    }
  }
  else {
    stm->rp = pbVar1 + 1;
    uVar4 = (uint)*pbVar1;
  }
  return uVar4;
}

Assistant:

static inline int hd_read_byte(hd_context *ctx, hd_stream *stm)
{
    int c = EOF;

    if (stm->rp != stm->wp)
        return *stm->rp++;
    hd_try(ctx)
    {
        c = stm->next(ctx, stm, 1);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "read error; treating as end of file");
        stm->error = 1;
        c = EOF;
    }
    if (c == EOF)
        stm->eof = 1;
    return c;
}